

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,1,0,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  void *pvVar1;
  comm *comm_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  _Map_pointer pppVar3;
  _Map_pointer pppVar4;
  comm *comm_01;
  _Elt_pointer ppVar5;
  _Elt_pointer ppVar6;
  _Elt_pointer ppVar7;
  _Elt_pointer ppVar8;
  ulong uVar9;
  unsigned_long uVar10;
  pair<unsigned_long,_unsigned_long> *ppVar11;
  pointer puVar12;
  int iVar13;
  int iVar14;
  ulong *puVar15;
  _Elt_pointer ppVar16;
  _Elt_pointer ppVar17;
  long lVar18;
  unsigned_long uVar19;
  unsigned_long uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  size_t local_size;
  unsigned_long local_min;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1c8;
  _Elt_pointer local_170;
  _Elt_pointer local_168;
  comm *local_160;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_158;
  _Elt_pointer local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  _Elt_pointer local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_128;
  size_type local_120;
  pair<unsigned_long,_unsigned_long> local_118;
  _Elt_pointer local_108;
  ulong local_100;
  unsigned_long local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  _Elt_pointer local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_158 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_128 = right_nsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1c8,0);
  local_120 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_160 = comm;
  local_170 = (_Elt_pointer)mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_120,comm);
  lVar24 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar24 != 0) {
    lVar24 = lVar24 >> 3;
    lVar23 = (long)local_170 - 1;
LAB_0013a7eb:
    do {
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar24 + -1] < ppVar6[-1].first) {
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0013a7eb;
        }
      }
      while (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar24 + -1] != ppVar6[-1].first) break;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar24 + lVar23);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar24 + -1];
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1c8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
  }
  local_50.current._M_cur = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_148,&local_50,&local_70,(allocator_type *)&local_90);
  pvVar1 = *(void **)local_158;
  *(pointer *)local_158 =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_158 + 8) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_158 + 0x10) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  local_f8 = nonsv;
  if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar4 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar3 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_168 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_150 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar9 = ((long)local_1c8._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
          ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
          ((((ulong)((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)((_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                 (_Elt_pointer)0x0)) * 0x20;
  local_108 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar6 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar17 = local_170;
  if (uVar9 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 1]"
                 );
  }
  for (; local_170 = ppVar17, ppVar6 < pppVar4; ppVar6 = (_Elt_pointer)&ppVar6->second) {
    operator_delete((void *)ppVar6->second);
    ppVar17 = local_170;
  }
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar3;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_150;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = local_108;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = local_168;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar25 = 0;
LAB_0013aaa0:
    do {
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar25] < ppVar6[-1].first) {
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0013aaa0;
        }
      }
      while (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar25] != ppVar6[-1].first) break;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar25 + (long)ppVar17);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar25];
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1c8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar17 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar25 = (long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar27 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node ==
           (_Elt_pointer)0x0;
  local_170 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1c8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1c8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_130 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_168 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_78 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_158,*(undefined8 *)(local_158 + 8));
  pppVar3 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar24 = (long)ppVar17 - (long)local_168;
  local_168 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_100 = (local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar24 = ((long)ppVar6 - (long)local_170 >> 4) + (lVar24 >> 4) +
           (((uVar25 >> 3) - 1) + (ulong)bVar27) * 0x20;
  ppVar17 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar7 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar5 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar6 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_160;
  if (lVar24 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 1]"
                 );
  }
  for (; local_170 = ppVar5, local_108 = ppVar7, local_150 = ppVar17, local_160 = comm_00,
      ppVar6 < pppVar3; ppVar6 = (_Elt_pointer)&ppVar6->second) {
    operator_delete((void *)ppVar6->second);
    ppVar17 = local_150;
    ppVar7 = local_108;
    ppVar5 = local_170;
    comm_00 = local_160;
  }
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_168;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = local_150;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = local_108;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_170;
  if (lVar24 + uVar9 != *(long *)(local_158 + 8) - *(long *)local_158 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 1]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_148,&local_100,1,comm_00);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_90,(long)comm_00->m_size,(value_type_conflict *)&local_a8,
             (allocator_type *)&local_f0);
  local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8,(long)comm_00->m_size,(value_type_conflict *)&local_f0,
             (allocator_type *)&local_c0);
  comm_01 = local_160;
  iVar14 = comm_00->m_rank;
  lVar24 = (long)iVar14;
  if (0 < lVar24) {
    uVar25 = *(ulong *)((long)local_148.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -8);
    local_170 = (_Elt_pointer)
                local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar23 = lVar24;
    uVar10 = 0;
    do {
      lVar18 = lVar23 + -1;
      uVar26 = uVar10 + 1;
      if (uVar10 + 1 < uVar9) {
        uVar26 = uVar9;
      }
      puVar15 = (ulong *)(uVar10 * 0x10 + *(long *)local_158);
      uVar19 = uVar10 - 1;
      do {
        uVar20 = uVar26 - 1;
        if ((1 - uVar26) + uVar19 == -1) break;
        uVar22 = *puVar15;
        uVar20 = uVar19 + 1;
        puVar15 = puVar15 + 2;
        uVar19 = uVar20;
      } while (*(ulong *)((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar18 * 8) <= uVar22);
      uVar26 = *(ulong *)((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar18 * 8);
      iVar13 = 0x12;
      if (uVar26 <= uVar25) {
        *(unsigned_long *)
         ((long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18 * 8) = (uVar20 - uVar10) + 1;
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar18] = uVar10;
        iVar13 = (uint)(*(ulong *)((long)local_148.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar18 * 8) <
                       local_100) << 4;
        uVar25 = uVar26;
      }
    } while (((iVar13 == 0x12) || (iVar13 == 0)) &&
            (bVar27 = 1 < lVar23, lVar23 = lVar18, uVar10 = uVar20, bVar27));
  }
  iVar13 = local_160->m_size;
  if ((iVar14 < iVar13 + -1) && (iVar14 + 1 < iVar13)) {
    lVar23 = *(long *)local_158;
    uVar25 = ((unsigned_long *)
             ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar24];
    lVar24 = lVar24 + 1;
    uVar26 = (*(long *)(local_158 + 8) - lVar23 >> 4) - 1;
    do {
      uVar22 = uVar26;
      if (uVar9 < uVar26) {
        puVar15 = (ulong *)(uVar26 * 0x10 + lVar23);
        uVar21 = uVar26;
        do {
          uVar22 = uVar21;
          if (*puVar15 <
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24]) break;
          uVar21 = uVar21 - 1;
          puVar15 = puVar15 + -2;
          uVar22 = uVar9;
        } while (uVar9 < uVar21);
      }
      uVar21 = local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar24];
      iVar14 = 0x17;
      if (uVar21 <= uVar25) {
        local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar24] = (uVar26 - uVar22) + 1;
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar24] = uVar22;
        iVar14 = 0;
        uVar25 = uVar21;
        if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar24] < local_100) {
          iVar14 = 0x15;
        }
      }
    } while (((iVar14 == 0x17) || (iVar14 == 0)) &&
            (lVar24 = lVar24 + 1, uVar26 = uVar22, iVar13 != (int)lVar24));
  }
  mxx::all2all<unsigned_long>(&local_f0,&local_90,local_160);
  mxx::impl::get_displacements<unsigned_long>(&local_c0,&local_f0);
  pvVar2 = local_128;
  uVar10 = local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar19 = local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_d8,uVar10 + uVar19,(allocator_type *)&local_118);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_158,&local_90,&local_a8,
             local_d8.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f0,&local_c0,comm_01);
  local_170 = (_Elt_pointer)
              local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_01->m_rank];
  local_150 = (_Elt_pointer)(uVar10 + uVar19);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_120);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar2,local_120);
  pppVar4 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar3 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar17 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_160 = (comm *)local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_168 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  for (ppVar6 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
      ppVar6 < pppVar4; ppVar6 = (_Elt_pointer)&ppVar6->second) {
    operator_delete((void *)ppVar6->second);
  }
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar3;
  lVar24 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)local_160;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = local_168;
  if (lVar24 != 0) {
    uVar10 = lVar24 >> 3;
    do {
      uVar10 = uVar10 - 1;
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar12 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        bVar27 = false;
        do {
          ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar6 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          uVar9 = puVar12[uVar10];
          if (ppVar6[-1].first <= uVar9) {
            if (!bVar27) {
              ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar6 = (_Elt_pointer)
                         (((_Elt_pointer)
                          ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10)
                          )->second + 0x200);
              }
              if (uVar9 == ppVar6[-1].first) {
                ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar6 = (_Elt_pointer)
                           (((_Elt_pointer)
                            ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node +
                            -0x10))->second + 0x200);
                }
                (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[ppVar6[-1].second] = uVar10;
                if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       (_Elt_pointer)
                       ((_Elt_pointer)
                       ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second;
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       (_Map_pointer)
                       &((_Elt_pointer)
                        ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
                }
                else {
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
              }
            }
            break;
          }
          ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar6 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar6[-1].second] = uVar10;
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          bVar27 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                   local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        } while (!bVar27);
      }
      local_118.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar10];
      local_118.second = uVar10;
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1c8,&local_118);
      }
      else {
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_118.first;
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar10;
        local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (uVar10 != 0);
  }
  if (local_170 != (_Elt_pointer)0x0) {
    uVar9 = 0;
    do {
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      ppVar11 = local_d8.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + ~uVar9 + (long)local_170;
      uVar10 = ~uVar9 + (long)local_170 + local_120;
      bVar27 = false;
      do {
        ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if (ppVar6[-1].first <= ppVar11->first) {
          if (!bVar27) {
            ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar6 = (_Elt_pointer)
                       (((_Elt_pointer)
                        ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second + 0x200);
            }
            if (ppVar11->first == ppVar6[-1].first) {
              ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar6 = (_Elt_pointer)
                         (((_Elt_pointer)
                          ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10)
                          )->second + 0x200);
              }
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[ppVar6[-1].second] = uVar10;
              if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     (_Elt_pointer)
                     ((_Elt_pointer)
                     ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     (_Map_pointer)
                     &((_Elt_pointer)
                      ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
              }
              else {
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            }
          }
          break;
        }
        ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar6[-1].second] = uVar10;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        bVar27 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                 local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while (!bVar27);
      uVar9 = uVar9 + 1;
    } while ((_Elt_pointer)uVar9 != local_170);
  }
  pppVar4 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar3 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar7 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar17 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_160 = (comm *)local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar6 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar2 = local_128;
  if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar12 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar8 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVar16 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      if (ppVar5 == ppVar8) {
        ppVar8 = (_Elt_pointer)ppVar16[-1].second;
        ppVar16 = (_Elt_pointer)&ppVar16[-1].second;
        puVar12[ppVar8[0x1f].second] = local_f8;
        ppVar5 = ppVar8 + 0x20;
      }
      else {
        puVar12[ppVar5[-1].second] = local_f8;
      }
      ppVar5 = ppVar5 + -1;
    } while (ppVar5 != local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; local_128 = pvVar2, ppVar6 < pppVar4; ppVar6 = (_Elt_pointer)&ppVar6->second) {
    operator_delete((void *)ppVar6->second);
    pvVar2 = local_128;
  }
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar7;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar3;
  puVar12 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)local_160;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar12) {
    uVar10 = 0;
LAB_0013b465:
    do {
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if (puVar12[uVar10] < ppVar6[-1].first) {
          ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar6 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar6[-1].second] = uVar10;
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0013b465;
        }
      }
      local_118.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar10];
      local_118.second = uVar10;
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1c8,&local_118);
      }
      else {
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_118.first;
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar10;
        local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar10 = uVar10 + 1;
      puVar12 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3
                             ));
  }
  if (local_150 != local_170) {
    lVar23 = (long)local_150 - (long)local_170;
    lVar24 = 0;
    do {
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      ppVar11 = local_d8.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar24 + (long)local_170;
      uVar10 = lVar24 + (long)local_170 + local_120;
      do {
        ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if (ppVar6[-1].first <= ppVar11->first) break;
        ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        (local_128->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar6[-1].second] = uVar10;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      } while (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur);
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar23 + (ulong)(lVar23 == 0));
  }
  if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar12 = (local_128->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
    ppVar7 = (_Elt_pointer)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar17 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar6 == ppVar17) {
        ppVar17 = (_Elt_pointer)ppVar7[-1].second;
        ppVar7 = (_Elt_pointer)&ppVar7[-1].second;
        puVar12[ppVar17[0x1f].second] = local_f8;
        ppVar6 = ppVar17 + 0x20;
      }
      else {
        puVar12[ppVar6[-1].second] = local_f8;
      }
      ppVar6 = ppVar6 + -1;
    } while (ppVar6 != local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_158,&local_d8);
  if (local_d8.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1c8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}